

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O1

void SstWriterClose(SstStream Stream)

{
  int *buffer;
  CPTimestepList p_Var1;
  size_t sVar2;
  StepRequest __ptr;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  NameListEntry *Tmp;
  NameListEntry *pNVar10;
  NameListEntry *__ptr_00;
  pthread_mutex_t *__mutex;
  ulong uVar11;
  NameListEntry **ppNVar12;
  timeval CloseTime;
  uint local_68 [2];
  ReleaseRecPtr local_60;
  
  __mutex = &Stream->DataLock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  Stream->CloseTimestepCount = Stream->WriterTimestep;
  if ((Stream->ConfigParams->StepDistributionMode != 2) ||
     (Stream->LastDemandTimestep == Stream->WriterTimestep)) {
    SendCloseMsgs(Stream);
  }
  for (p_Var1 = Stream->QueuedTimesteps; p_Var1 != (CPTimestepList)0x0; p_Var1 = p_Var1->Next) {
    if (p_Var1->PreciousTimestep != 0) {
      CP_verbose(Stream,TraceVerbose,"Precious Timestep %ld untagged, reference count is %d\n",
                 p_Var1->Timestep,(ulong)(uint)p_Var1->ReferenceCount);
      p_Var1->Expired = 1;
      p_Var1->PreciousTimestep = 0;
    }
  }
  Stream->ConfigParams->ReserveQueueLimit = 0;
  QueueMaintenance(Stream);
  usleep(100000);
  sVar2 = Stream->ConfigParams->CPCommPattern;
  if ((sVar2 == 1) || (Stream->Rank == 0)) {
    buffer = &Stream->ReleaseCount;
    if (0 < Stream->ReleaseCount) {
      if (sVar2 == 0) {
        SMPI_Bcast(buffer,1,SMPI_INT,0,Stream->mpiComm);
        SMPI_Bcast(Stream->ReleaseList,Stream->ReleaseCount << 4,SMPI_BYTE,0,Stream->mpiComm);
      }
      Stream->ReleaseCount = 0;
      free(Stream->ReleaseList);
      Stream->ReleaseList = (_ReleaseRec *)0x0;
    }
    while (__ptr = Stream->StepRequestQueue, __ptr != (StepRequest)0x0) {
      Stream->StepRequestQueue = __ptr->Next;
      free(__ptr);
    }
    if (Stream->QueuedTimesteps != (CPTimestepList)0x0) {
      do {
        CP_verbose(Stream,PerStepVerbose,"Waiting for timesteps to be released in WriterClose\n");
        if (4 < Stream->CPVerbosityLevel) {
          p_Var1 = Stream->QueuedTimesteps;
          pcVar5 = (char *)malloc(1);
          *pcVar5 = '\0';
          for (; p_Var1 != (CPTimestepList)0x0; p_Var1 = p_Var1->Next) {
            CP_verbose(Stream,TraceVerbose,
                       "IN TS WAIT, ENTRIES are Timestep %ld (exp %d, Prec %d, Ref %d), Count now %d\n"
                       ,p_Var1->Timestep,(ulong)(uint)p_Var1->Expired,
                       (ulong)(uint)p_Var1->PreciousTimestep,(ulong)(uint)p_Var1->ReferenceCount,
                       (ulong)(uint)Stream->QueuedTimestepCount);
            snprintf((char *)&CloseTime,0x1e,"%zd ",p_Var1->Timestep);
            sVar6 = strlen(pcVar5);
            sVar7 = strlen((char *)&CloseTime);
            pcVar5 = (char *)realloc(pcVar5,sVar7 + sVar6 + 1);
            strcat(pcVar5,(char *)&CloseTime);
          }
          CP_verbose(Stream,TraceVerbose,"The timesteps still queued are: %s\n",pcVar5);
          free(pcVar5);
        }
        CP_verbose(Stream,TraceVerbose,"Reader Count is %d\n");
        if (0 < Stream->ReaderCount) {
          uVar11 = 0;
          do {
            CP_verbose(Stream,TraceVerbose,"Reader [%d] status is %s\n",uVar11 & 0xffffffff,
                       SSTStreamStatusStr[Stream->Readers[uVar11]->ReaderStatus]);
            uVar11 = uVar11 + 1;
          } while ((long)uVar11 < (long)Stream->ReaderCount);
        }
        pthread_cond_wait((pthread_cond_t *)&Stream->DataCondition,(pthread_mutex_t *)__mutex);
        if (Stream->ConfigParams->CPCommPattern == 0) {
          SMPI_Bcast(buffer,1,SMPI_INT,0,Stream->mpiComm);
          if (0 < Stream->ReleaseCount) {
            SMPI_Bcast(Stream->ReleaseList,Stream->ReleaseCount << 4,SMPI_BYTE,0,Stream->mpiComm);
            Stream->ReleaseCount = 0;
            free(Stream->ReleaseList);
            Stream->ReleaseList = (_ReleaseRec *)0x0;
          }
        }
      } while (Stream->QueuedTimesteps != (CPTimestepList)0x0);
    }
    if (Stream->ConfigParams->CPCommPattern == 0) {
      Stream->ReleaseCount = -1;
      SMPI_Bcast(buffer,1,SMPI_INT,0,Stream->mpiComm);
      Stream->ReleaseCount = 0;
    }
  }
  if (Stream->ConfigParams->CPCommPattern == 0) {
    if (Stream->Rank != 0) {
      SMPI_Bcast(local_68,1,SMPI_INT,0,Stream->mpiComm);
      if (local_68[0] != 0xffffffff) {
        do {
          uVar3 = local_68[0];
          if (0 < (int)local_68[0]) {
            local_60 = (ReleaseRecPtr)malloc((ulong)local_68[0] << 4);
            SMPI_Bcast(local_60,uVar3 << 4,SMPI_BYTE,0,Stream->mpiComm);
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            ProcessReleaseList(Stream,(ReturnMetadataInfo)&CloseTime);
            pthread_mutex_lock((pthread_mutex_t *)__mutex);
            free(local_60);
            local_60 = (ReleaseRecPtr)0x0;
          }
          SMPI_Bcast(local_68,1,SMPI_INT,0,Stream->mpiComm);
        } while (local_68[0] != 0xffffffff);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    SMPI_Barrier(Stream->mpiComm);
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  gettimeofday((timeval *)&CloseTime,(__timezone_ptr_t)0x0);
  lVar8 = CloseTime.tv_usec - (Stream->ValidStartTime).tv_usec;
  lVar9 = lVar8 + 1000000;
  if (-1 < lVar8) {
    lVar9 = lVar8;
  }
  (Stream->Stats).StreamValidTimeSecs =
       (double)((lVar8 >> 0x3f) + (CloseTime.tv_sec - (Stream->ValidStartTime).tv_sec)) +
       (double)lVar9 / 1000000.0;
  if (1 < Stream->CPVerbosityLevel) {
    DoStreamSummary(Stream);
  }
  CP_verbose(Stream,PerStepVerbose,"All timesteps are released in WriterClose\n");
  if ((Stream->Rank == 0) && (Stream->RegistrationMethod == SstRegisterFile)) {
    pcVar5 = Stream->AbsoluteFilename;
    unlink(pcVar5);
    __ptr_00 = FileNameList;
    ppNVar12 = &FileNameList;
    if (FileNameList != (NameListEntry *)0x0) {
      iVar4 = strcmp(pcVar5,FileNameList->FileName);
      if (iVar4 != 0) {
        do {
          pNVar10 = __ptr_00;
          __ptr_00 = pNVar10->Next;
          if (__ptr_00 == (NameListEntry *)0x0) {
            return;
          }
          iVar4 = strcmp(pcVar5,__ptr_00->FileName);
        } while (iVar4 != 0);
        ppNVar12 = &pNVar10->Next;
      }
      *ppNVar12 = __ptr_00->Next;
      free(__ptr_00);
    }
  }
  return;
}

Assistant:

void SstWriterClose(SstStream Stream)
{
    struct timeval CloseTime, Diff;
    STREAM_MUTEX_LOCK(Stream);
    Stream->CloseTimestepCount = Stream->WriterTimestep;
    if ((Stream->ConfigParams->StepDistributionMode != StepsOnDemand) ||
        (Stream->LastDemandTimestep == Stream->CloseTimestepCount))
    {
        /* send if not OnDemand, or if all timesteps have been send OnDemand */
        SendCloseMsgs(Stream);
    }
    UntagPreciousTimesteps(Stream);
    Stream->ConfigParams->ReserveQueueLimit = 0;
    QueueMaintenance(Stream);

    // sleep briefly to allow for outgoing close messages to arrive
    usleep(100 * 1000);

    if ((Stream->ConfigParams->CPCommPattern == SstCPCommPeer) || (Stream->Rank == 0))
    {
        if (Stream->ReleaseCount > 0)
        {
            if (Stream->ConfigParams->CPCommPattern == SstCPCommMin)
            {
                SMPI_Bcast(&Stream->ReleaseCount, 1, SMPI_INT, 0, Stream->mpiComm);
                SMPI_Bcast(Stream->ReleaseList,
                           Stream->ReleaseCount * sizeof(*(Stream->ReleaseList)), SMPI_BYTE, 0,
                           Stream->mpiComm);
            }
            Stream->ReleaseCount = 0;
            free(Stream->ReleaseList);
            Stream->ReleaseList = NULL;
        }
        while (Stream->StepRequestQueue)
        {
            StepRequest Request = Stream->StepRequestQueue;
            Stream->StepRequestQueue = Request->Next;
            free(Request);
        }
        while (Stream->QueuedTimesteps)
        {
            CP_verbose(Stream, PerStepVerbose,
                       "Waiting for timesteps to be released in WriterClose\n");
            if (Stream->CPVerbosityLevel >= TraceVerbose)
            {
                CPTimestepList List = Stream->QueuedTimesteps;
                char *StringList = malloc(1);
                StringList[0] = 0;

                while (List)
                {
                    char tmp[30];
                    CP_verbose(Stream, TraceVerbose,
                               "IN TS WAIT, ENTRIES are Timestep %ld (exp %d, "
                               "Prec %d, Ref %d), Count now %d\n",
                               List->Timestep, List->Expired, List->PreciousTimestep,
                               List->ReferenceCount, Stream->QueuedTimestepCount);
                    snprintf(tmp, sizeof(tmp), "%zd ", List->Timestep);
                    StringList = realloc(StringList, strlen(StringList) + strlen(tmp) + 1);
                    strcat(StringList, tmp);
                    List = List->Next;
                }
                CP_verbose(Stream, TraceVerbose, "The timesteps still queued are: %s\n",
                           StringList);
                free(StringList);
            }
            CP_verbose(Stream, TraceVerbose, "Reader Count is %d\n", Stream->ReaderCount);
            for (int i = 0; i < Stream->ReaderCount; i++)
            {
                CP_verbose(Stream, TraceVerbose, "Reader [%d] status is %s\n", i,
                           SSTStreamStatusStr[Stream->Readers[i]->ReaderStatus]);
            }
            /* NEED TO HANDLE FAILURE HERE */
            STREAM_CONDITION_WAIT(Stream);
            if (Stream->ConfigParams->CPCommPattern == SstCPCommMin)
            {
                SMPI_Bcast(&Stream->ReleaseCount, 1, SMPI_INT, 0, Stream->mpiComm);
                if (Stream->ReleaseCount > 0)
                {
                    SMPI_Bcast(Stream->ReleaseList,
                               Stream->ReleaseCount * sizeof(*(Stream->ReleaseList)), SMPI_BYTE, 0,
                               Stream->mpiComm);
                    Stream->ReleaseCount = 0;
                    free(Stream->ReleaseList);
                    Stream->ReleaseList = NULL;
                }
            }
        }
        if (Stream->ConfigParams->CPCommPattern == SstCPCommMin)
        {
            Stream->ReleaseCount = -1;
            SMPI_Bcast(&Stream->ReleaseCount, 1, SMPI_INT, 0, Stream->mpiComm);
            Stream->ReleaseCount = 0;
        }
    }

    if (Stream->ConfigParams->CPCommPattern == SstCPCommMin)
    {
        if (Stream->Rank != 0)
        {
            struct _ReturnMetadataInfo ReleaseData;
            while (1)
            {
                SMPI_Bcast(&ReleaseData.ReleaseCount, 1, SMPI_INT, 0, Stream->mpiComm);
                if (ReleaseData.ReleaseCount == -1)
                {
                    break;
                }
                else if (ReleaseData.ReleaseCount > 0)
                {
                    ReleaseData.ReleaseList =
                        malloc(ReleaseData.ReleaseCount * sizeof(*ReleaseData.ReleaseList));
                    SMPI_Bcast(ReleaseData.ReleaseList,
                               ReleaseData.ReleaseCount * sizeof(*ReleaseData.ReleaseList),
                               SMPI_BYTE, 0, Stream->mpiComm);
                    STREAM_MUTEX_UNLOCK(Stream);
                    ProcessReleaseList(Stream, &ReleaseData);
                    STREAM_MUTEX_LOCK(Stream);
                    free(ReleaseData.ReleaseList);
                    ReleaseData.ReleaseList = NULL;
                }
            }
        }
        /*
         * if we're CommMin, getting here implies that Rank 0 has released all
         * timesteps, other ranks can follow suit after barrier
         */
        STREAM_MUTEX_UNLOCK(Stream);
        SMPI_Barrier(Stream->mpiComm);
        STREAM_MUTEX_LOCK(Stream);
    }
    STREAM_MUTEX_UNLOCK(Stream);
    gettimeofday(&CloseTime, NULL);
    timersub(&CloseTime, &Stream->ValidStartTime, &Diff);
    Stream->Stats.StreamValidTimeSecs = (double)Diff.tv_usec / 1e6 + Diff.tv_sec;

    if (Stream->CPVerbosityLevel >= (int)SummaryVerbose)
    {
        DoStreamSummary(Stream);
    }
    CP_verbose(Stream, PerStepVerbose, "All timesteps are released in WriterClose\n");

    /*
     *  Only rank 0 removes contact info, and only when everything is closed.
     */
    if (Stream->Rank == 0)
    {
        removeContactInfo(Stream);
    }
}